

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

SurfaceInteraction * __thiscall
pbrt::Disk::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Disk *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  Transform *this_00;
  Transform *pTVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Point3fi pi;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  Vector3f wo_00;
  Vector3f dpdu;
  Vector3f dpdv;
  Point3f pHit;
  undefined8 local_198;
  undefined8 local_188;
  ulong local_178;
  Point2f local_168;
  Tuple3<pbrt::Vector3,_float> local_158;
  Point3f local_148;
  Point3fi local_138;
  SurfaceInteraction local_120;
  
  local_148.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  local_148.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_148.super_Tuple3<pbrt::Point3,_float>._0_8_;
  fVar1 = this->phiMax;
  fVar2 = this->radius;
  local_148.super_Tuple3<pbrt::Point3,_float>.z = this->height;
  auVar7._8_4_ = 0x80000000;
  auVar7._0_8_ = 0x8000000080000000;
  auVar7._12_4_ = 0x80000000;
  auVar11 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar7);
  local_158.x = 0.0;
  local_158.y = 0.0;
  local_158.z = 0.0;
  auVar7 = vmovshdup_avx(auVar14);
  fVar8 = this->innerRadius - fVar2;
  fVar15 = auVar7._0_4_;
  bVar4 = this->reverseOrientation;
  this_00 = this->renderFromObject;
  fVar3 = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  bVar5 = this->transformSwapsHandedness;
  pTVar6 = this->objectFromRender;
  auVar7 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar2 - this->innerRadius)),0x10);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15)),auVar14,auVar14);
  auVar12 = vsqrtss_avx(auVar12,auVar12);
  fVar16 = auVar12._0_4_;
  auVar12 = vinsertps_avx(ZEXT416((uint)isect->phi),ZEXT416((uint)(fVar2 - fVar16)),0x10);
  auVar7 = vdivps_avx(auVar12,auVar7);
  fVar2 = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pTVar6->m).m[1][1])),ZEXT416((uint)fVar2),
                            ZEXT416((uint)(pTVar6->m).m[1][0]));
  auVar11 = vinsertps_avx(ZEXT416((uint)(fVar15 * auVar11._0_4_)),
                          ZEXT416((uint)(fVar1 * (float)local_148.super_Tuple3<pbrt::Point3,_float>.
                                                        x)),0x10);
  auVar13._4_4_ = fVar16;
  auVar13._0_4_ = fVar16;
  auVar13._8_4_ = fVar16;
  auVar13._12_4_ = fVar16;
  auVar12._0_4_ = fVar8 * (float)local_148.super_Tuple3<pbrt::Point3,_float>.x;
  auVar12._4_4_ = fVar8 * (float)local_148.super_Tuple3<pbrt::Point3,_float>.y;
  auVar12._8_4_ = fVar8 * 0.0;
  auVar12._12_4_ = fVar8 * 0.0;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pTVar6->m).m[0][1])),ZEXT416((uint)fVar2),
                           ZEXT416((uint)(pTVar6->m).m[0][0]));
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pTVar6->m).m[2][1])),ZEXT416((uint)fVar2),
                            ZEXT416((uint)(pTVar6->m).m[2][0]));
  auVar12 = vdivps_avx(auVar12,auVar13);
  fVar1 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar1),ZEXT416((uint)(pTVar6->m).m[0][2]));
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar1),ZEXT416((uint)(pTVar6->m).m[1][2]));
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar1),ZEXT416((uint)(pTVar6->m).m[2][2]));
  auVar14 = vinsertps_avx(auVar9,auVar14,0x10);
  Point3fi::Point3fi(&local_138,&local_148,(Vector3f *)&local_158);
  local_168.super_Tuple2<pbrt::Point2,_float> = auVar7._0_8_;
  local_198 = auVar14._0_8_;
  local_178 = auVar11._0_8_;
  local_188 = auVar12._0_8_;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.z = auVar10._0_4_;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_198;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_198._4_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_178;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_178._4_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.z = (fVar8 * 0.0) / fVar16;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_188;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_188._4_4_;
  SurfaceInteraction::SurfaceInteraction
            (&local_120,pi,local_168,wo_00,dpdu,dpdv,(Normal3f)ZEXT812(0),(Normal3f)ZEXT812(0),time,
             bVar4 != bVar5);
  Transform::operator()(__return_storage_ptr__,this_00,&local_120);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of disk hit
        Float u = phi / phiMax;
        Float rHit = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        Float v = (radius - rHit) / (radius - innerRadius);
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv = Vector3f(pHit.x, pHit.y, 0.) * (innerRadius - radius) / rHit;
        Normal3f dndu(0, 0, 0), dndv(0, 0, 0);

        // Refine disk intersection point
        pHit.z = height;

        // Compute error bounds for disk intersection
        Vector3f pError(0, 0, 0);

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }